

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_multisample_interpolation
               (NegativeTestContext *ctx)

{
  ostream *poVar1;
  long lVar2;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "GL_OES_shader_multisample_interpolation features require enabling the extension in 310 es shaders."
             ,&local_1e9);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"Test sample in/out qualifiers.",&local_1e9);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    poVar1 = std::operator<<((ostream *)&source,"#version 310 es\n\t");
    poVar1 = std::operator<<(poVar1,(char *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_132shader_multisample_interpolationERNS2_19NegativeTestContextEE13s_sampleTests_rel
                                            + (long)*(int *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_132shader_multisample_interpolationERNS2_19NegativeTestContextEE13s_sampleTests_rel
                                                  + lVar2)));
    std::operator<<(poVar1,"\nprecision mediump float;\nvoid main()\n{\n}\n");
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_1c8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  }
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"Test interpolateAt* functions.",&local_1e9);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    poVar1 = std::operator<<((ostream *)&source,
                             "#version 310 es\nin mediump float interpolant;\nprecision mediump float;\nvoid main()\n{\n\t"
                            );
    poVar1 = std::operator<<(poVar1,(char *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_132shader_multisample_interpolationERNS2_19NegativeTestContextEE20s_interpolateAtTests_rel
                                            + (long)*(int *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_132shader_multisample_interpolationERNS2_19NegativeTestContextEE20s_interpolateAtTests_rel
                                                  + lVar2)));
    std::operator<<(poVar1,"\n}\n");
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_1e8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  }
  NegativeTestContext::endSection(ctx);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void shader_multisample_interpolation (NegativeTestContext& ctx)
{
	static const char* const s_sampleTests[] =
	{
		"sample in highp float v_var;",
		"sample out highp float v_var;"
	};

	static const char* const s_interpolateAtTests[] =
	{
		"interpolateAtCentroid(interpolant);",
		"interpolateAtSample(interpolant, 1);",
		"interpolateAtOffset(interpolant, vec2(1.0, 0.0));"
	};

	ctx.beginSection("GL_OES_shader_multisample_interpolation features require enabling the extension in 310 es shaders.");
	ctx.beginSection("Test sample in/out qualifiers.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_sampleTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"	" << s_sampleTests[ndx] << "\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();

	ctx.beginSection("Test interpolateAt* functions.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_sampleTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"in mediump float interpolant;\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"	" << s_interpolateAtTests[ndx] << "\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
	ctx.endSection();
}